

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool SetPropertyCommand::HandleAndValidateSourceFilePropertyGENERATED
               (cmSourceFile *sf,string *propertyValue,PropertyOp op)

{
  cmMakefile *this;
  bool bVar1;
  PolicyStatus PVar2;
  cmSourceFileLocation *pcVar3;
  PolicyID id;
  PolicyID id_00;
  PolicyID extraout_EDX;
  PolicyID id_01;
  char *extraout_RDX;
  cmAlphaNum *this_00;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  cmAlphaNum local_c8;
  string local_98;
  string local_78;
  cmAlphaNum local_58;
  
  this_00 = &local_c8;
  pcVar3 = cmSourceFile::GetLocation(sf);
  this = pcVar3->Makefile;
  PVar2 = cmMakefile::GetPolicyStatus(this,CMP0118,false);
  if (PVar2 == OLD) {
LAB_0026e36c:
    switch(op) {
    case Remove:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"GENERATED",(allocator<char> *)&local_58);
      cmSourceFile::SetProperty(sf,(string *)&local_c8,(char *)0x0);
      break;
    case Set:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"GENERATED",(allocator<char> *)&local_58);
      cmSourceFile::SetProperty(sf,(string *)&local_c8,(cmValue)propertyValue);
      this_00 = &local_c8;
      break;
    case Append:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"GENERATED",(allocator<char> *)&local_58);
      cmSourceFile::AppendProperty(sf,(string *)&local_c8,propertyValue,false);
      this_00 = &local_c8;
      break;
    case AppendAsString:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"GENERATED",(allocator<char> *)&local_58);
      cmSourceFile::AppendProperty(sf,(string *)&local_c8,propertyValue,true);
      this_00 = &local_c8;
      break;
    default:
      goto switchD_0026e385_default;
    }
  }
  else {
    if (PVar2 == WARN) {
      value_03._M_str = extraout_RDX;
      value_03._M_len = (size_t)(propertyValue->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)propertyValue->_M_string_length,value_03);
      if ((!bVar1) &&
         (value._M_str = (propertyValue->_M_dataplus)._M_p,
         value._M_len = propertyValue->_M_string_length, bVar1 = cmValue::IsOff(value), !bVar1)) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_78,(cmPolicies *)0x76,id);
        local_c8.View_._M_len = local_78._M_string_length;
        local_c8.View_._M_str = local_78._M_dataplus._M_p;
        local_58.View_._M_len = 0x6e;
        local_58.View_._M_str =
             "\nAttempt to set property \'GENERATED\' with the following non-boolean value (which will be interpreted as \"0\"):\n"
        ;
        cmStrCat<std::__cxx11::string,char[129]>
                  (&local_98,&local_c8,&local_58,propertyValue,
                   (char (*) [129])
                   "\nThat exact value will not be retrievable. A value of \"0\" will be returned instead.\nThis will be an error under policy CMP0118.\n"
                  );
        cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
      }
      value_00._M_str = (propertyValue->_M_dataplus)._M_p;
      value_00._M_len = propertyValue->_M_string_length;
      bVar1 = cmValue::IsOff(value_00);
      id_01 = id_00;
      if (bVar1) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_78,(cmPolicies *)0x76,id_00);
        local_c8.View_._M_len = local_78._M_string_length;
        local_c8.View_._M_str = local_78._M_dataplus._M_p;
        local_58.View_._M_len = 0x4a;
        local_58.View_._M_str =
             "\nUnsetting property \'GENERATED\' will not be allowed under policy CMP0118!\n";
        cmStrCat<>(&local_98,&local_c8,&local_58);
        cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        id_01 = extraout_EDX;
      }
      if ((op & ~Set) == Append) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_78,(cmPolicies *)0x76,id_01);
        local_c8.View_._M_len = local_78._M_string_length;
        local_c8.View_._M_str = local_78._M_dataplus._M_p;
        local_58.View_._M_len = 0x4d;
        local_58.View_._M_str =
             "\nAppending to property \'GENERATED\' will not be allowed under policy CMP0118!\n";
        cmStrCat<>(&local_98,&local_c8,&local_58);
        cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
      }
      goto LAB_0026e36c;
    }
    value_04._M_str = extraout_RDX;
    value_04._M_len = (size_t)(propertyValue->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)propertyValue->_M_string_length,value_04);
    if ((bVar1) ||
       (value_01._M_str = (propertyValue->_M_dataplus)._M_p,
       value_01._M_len = propertyValue->_M_string_length, bVar1 = cmValue::IsOff(value_01), bVar1))
    {
      value_02._M_str = (propertyValue->_M_dataplus)._M_p;
      value_02._M_len = propertyValue->_M_string_length;
      bVar1 = cmValue::IsOff(value_02);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,
                   "Unsetting the \'GENERATED\' property is not allowed under CMP0118!\n",
                   (allocator<char> *)&local_58);
        cmMakefile::IssueMessage(this,AUTHOR_ERROR,(string *)&local_c8);
        this_00 = &local_c8;
      }
      else {
        if ((op & ~Set) != Append) {
          cmSourceFile::MarkAsGenerated(sf);
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,
                   "Policy CMP0118 is set to NEW and appending to the \'GENERATED\' property is therefore not allowed. Only setting it to \"1\" is allowed!\n"
                   ,(allocator<char> *)&local_58);
        cmMakefile::IssueMessage(this,AUTHOR_ERROR,(string *)&local_c8);
        this_00 = &local_c8;
      }
    }
    else {
      local_c8.View_._M_len = 0x7a;
      local_c8.View_._M_str =
           "Policy CMP0118 is set to NEW and the following non-boolean value given for property \'GENERATED\' is therefore not allowed:\n"
      ;
      local_58.View_._M_str = (propertyValue->_M_dataplus)._M_p;
      local_58.View_._M_len = propertyValue->_M_string_length;
      cmStrCat<char[35]>(&local_98,&local_c8,&local_58,
                         (char (*) [35])"\nReplace it with a boolean value!\n");
      cmMakefile::IssueMessage(this,AUTHOR_ERROR,&local_98);
      this_00 = (cmAlphaNum *)&local_98;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
switchD_0026e385_default:
  return true;
}

Assistant:

bool HandleAndValidateSourceFilePropertyGENERATED(
  cmSourceFile* sf, std::string const& propertyValue, PropertyOp op)
{
  const auto& mf = *sf->GetLocation().GetMakefile();
  auto policyStatus = mf.GetPolicyStatus(cmPolicies::CMP0118);

  const bool policyWARN = policyStatus == cmPolicies::WARN;
  const bool policyNEW = policyStatus != cmPolicies::OLD && !policyWARN;

  if (policyWARN) {
    if (!cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nAttempt to set property 'GENERATED' with the following "
                 "non-boolean value (which will be interpreted as \"0\"):\n",
                 propertyValue,
                 "\nThat exact value will not be retrievable. A value of "
                 "\"0\" will be returned instead.\n"
                 "This will be an error under policy CMP0118.\n"));
    }
    if (cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nUnsetting property 'GENERATED' will not be allowed under "
                 "policy CMP0118!\n"));
    }
    if (op == PropertyOp::Append || op == PropertyOp::AppendAsString) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nAppending to property 'GENERATED' will not be allowed "
                 "under policy CMP0118!\n"));
    }
  } else if (policyNEW) {
    if (!cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_ERROR,
        cmStrCat(
          "Policy CMP0118 is set to NEW and the following non-boolean value "
          "given for property 'GENERATED' is therefore not allowed:\n",
          propertyValue, "\nReplace it with a boolean value!\n"));
      return true;
    }
    if (cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_ERROR,
        "Unsetting the 'GENERATED' property is not allowed under CMP0118!\n");
      return true;
    }
    if (op == PropertyOp::Append || op == PropertyOp::AppendAsString) {
      mf.IssueMessage(MessageType::AUTHOR_ERROR,
                      "Policy CMP0118 is set to NEW and appending to the "
                      "'GENERATED' property is therefore not allowed. Only "
                      "setting it to \"1\" is allowed!\n");
      return true;
    }
  }

  // Set property.
  if (!policyNEW) {
    // Do it the traditional way.
    switch (op) {
      case PropertyOp::Append:
        sf->AppendProperty("GENERATED", propertyValue, false);
        break;
      case PropertyOp::AppendAsString:
        sf->AppendProperty("GENERATED", propertyValue, true);
        break;
      case PropertyOp::Remove:
        sf->SetProperty("GENERATED", nullptr);
        break;
      case PropertyOp::Set:
        sf->SetProperty("GENERATED", propertyValue);
        break;
    }
  } else {
    sf->MarkAsGenerated();
  }
  return true;
}